

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsSlicingBounded(void)

{
  reference piVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  Span<int,_18446744073709551615UL> SVar5;
  initializer_list<int> __l;
  Span<int,_18446744073709551615UL> sub;
  Span<int,_18446744073709551615UL> span;
  Span<int,_18446744073709551615UL> subsub;
  vector<int,_std::allocator<int>_> values;
  
  span.m_ptr = (pointer)0x200000001;
  span.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,(allocator_type *)&sub);
  span.m_ptr = (pointer)0x0;
  if ((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.m_ptr = values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  }
  span.m_size.m_size =
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  sub = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&span,1,2);
  if (sub.m_size.m_size.m_size == 2) {
    piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&sub,0);
    if (*piVar1 != 2) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1fa);
      poVar2 = std::operator<<(poVar2,": error: ");
      pcVar4 = "(sub[0]) == (2)";
      goto LAB_00176c0f;
    }
    piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&sub,1);
    if (*piVar1 != 3) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1fb);
      poVar2 = std::operator<<(poVar2,": error: ");
      pcVar4 = "(sub[1]) == (3)";
      goto LAB_00176c0f;
    }
    subsub = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&sub,0,1);
    if (subsub.m_size.m_size.m_size == 1) {
      piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&subsub,0);
      if (*piVar1 != 2) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1ff);
        poVar2 = std::operator<<(poVar2,": error: ");
        pcVar4 = "(subsub[0]) == (2)";
        goto LAB_00176cd1;
      }
      sub = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&span,3,1);
      if (sub.m_size.m_size.m_size == 1) {
        piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&sub,0);
        if (*piVar1 != 4) {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x205);
          poVar2 = std::operator<<(poVar2,": error: ");
          pcVar4 = "(sub[0]) == (4)";
          goto LAB_00176d81;
        }
        SVar5 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&span,0,span.m_size.m_size);
        if (SVar5.m_size.m_size.m_size == span.m_size.m_size) {
          if (SVar5.m_ptr == span.m_ptr) {
            iVar3 = 0;
            goto LAB_00176c31;
          }
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x20b);
          poVar2 = std::operator<<(poVar2,": error: ");
          pcVar4 = "(sub.Data()) == (span.Data())";
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x20a);
          poVar2 = std::operator<<(poVar2,": error: ");
          pcVar4 = "(sub.Size()) == (span.Size())";
        }
        poVar2 = std::operator<<(poVar2,pcVar4);
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x204);
        poVar2 = std::operator<<(poVar2,": error: ");
        pcVar4 = "(sub.Size()) == (size_t(1))";
LAB_00176d81:
        poVar2 = std::operator<<(poVar2,pcVar4);
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1fe);
      poVar2 = std::operator<<(poVar2,": error: ");
      pcVar4 = "(subsub.Size()) == (size_t(1))";
LAB_00176cd1:
      poVar2 = std::operator<<(poVar2,pcVar4);
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1f9);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar4 = "(sub.Size()) == (size_t(2))";
LAB_00176c0f:
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  iVar3 = 1;
LAB_00176c31:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return iVar3;
}

Assistant:

int testSpanTestsSlicingBounded()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    {
        auto sub = span.Slice(1, 2);
        ML_ASSERT_EQ(sub.Size(), size_t(2));
        ML_ASSERT_EQ(sub[0], 2);
        ML_ASSERT_EQ(sub[1], 3);

        auto subsub = sub.Slice(0, 1);
        ML_ASSERT_EQ(subsub.Size(), size_t(1));
        ML_ASSERT_EQ(subsub[0], 2);
    }

    {
        auto sub = span.Slice(3, 1);
        ML_ASSERT_EQ(sub.Size(), size_t(1));
        ML_ASSERT_EQ(sub[0], 4);
    }

    {
        auto sub = span.Slice(0, span.Size());
        ML_ASSERT_EQ(sub.Size(), span.Size());
        ML_ASSERT_EQ(sub.Data(), span.Data());
    }

    return 0;
}